

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiTextFilter::Build(ImGuiTextFilter *this)

{
  char *pcVar1;
  ImGuiTextRange *pIVar2;
  size_t sVar3;
  long lVar4;
  uint uVar5;
  ImGuiTextRange *pIVar6;
  char *pcVar7;
  int iVar8;
  char *pcVar9;
  ulong uVar10;
  ImGuiTextRange input_range;
  ImGuiTextRange local_38;
  
  iVar8 = (this->Filters).Capacity;
  if (iVar8 < 0) {
    uVar5 = iVar8 / 2 + iVar8;
    uVar10 = 0;
    if (0 < (int)uVar5) {
      uVar10 = (ulong)uVar5;
    }
    pIVar2 = (ImGuiTextRange *)ImGui::MemAlloc(uVar10 << 4);
    pIVar6 = (this->Filters).Data;
    if (pIVar6 != (ImGuiTextRange *)0x0) {
      memcpy(pIVar2,pIVar6,(long)(this->Filters).Size << 4);
      ImGui::MemFree((this->Filters).Data);
    }
    (this->Filters).Data = pIVar2;
    (this->Filters).Capacity = (int)uVar10;
  }
  iVar8 = 0;
  (this->Filters).Size = 0;
  sVar3 = strlen(this->InputBuf);
  local_38.e = this->InputBuf + sVar3;
  local_38.b = this->InputBuf;
  ImGuiTextRange::split(&local_38,',',&this->Filters);
  this->CountGrep = 0;
  lVar4 = (long)(this->Filters).Size;
  if (lVar4 != 0) {
    pIVar6 = (this->Filters).Data;
    pIVar2 = pIVar6 + lVar4;
    do {
      pcVar7 = pIVar6->b;
      if (pcVar7 < pIVar6->e) {
        do {
          if ((*pcVar7 != ' ') && (*pcVar7 != '\t')) break;
          pcVar7 = pcVar7 + 1;
          pIVar6->b = pcVar7;
        } while (pcVar7 != pIVar6->e);
      }
      pcVar1 = pIVar6->e;
      while (pcVar7 < pcVar1) {
        pcVar9 = pcVar1 + -1;
        if ((*pcVar9 != ' ') && (*pcVar9 != '\t')) break;
        pIVar6->e = pcVar9;
        pcVar1 = pcVar9;
      }
      if ((pcVar7 != pcVar1) && (*pcVar7 != '-')) {
        iVar8 = iVar8 + 1;
        this->CountGrep = iVar8;
      }
      pIVar6 = pIVar6 + 1;
    } while (pIVar6 != pIVar2);
  }
  return;
}

Assistant:

void ImGuiTextFilter::Build()
{
    Filters.resize(0);
    ImGuiTextRange input_range(InputBuf, InputBuf + strlen(InputBuf));
    input_range.split(',', &Filters);

    CountGrep = 0;
    for (ImGuiTextRange& f : Filters)
    {
        while (f.b < f.e && ImCharIsBlankA(f.b[0]))
            f.b++;
        while (f.e > f.b && ImCharIsBlankA(f.e[-1]))
            f.e--;
        if (f.empty())
            continue;
        if (f.b[0] != '-')
            CountGrep += 1;
    }
}